

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsObjectiveFunction.cpp
# Opt level: O2

void __thiscall
HighsObjectiveFunction::setupCliquePartition
          (HighsObjectiveFunction *this,HighsDomain *globaldom,HighsCliqueTable *cliqueTable)

{
  ulong uVar1;
  double *pdVar2;
  pointer piVar3;
  pointer piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  HighsLp *pHVar5;
  pointer pdVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  vector<int,_std::allocator<int>_> *partitionStart;
  bool local_5d;
  HighsInt col;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clqvars;
  
  iVar9 = this->numBinary;
  if (1 < (long)iVar9) {
    clqvars.
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clqvars.
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    clqvars.
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    piVar3 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar10 = 0; (long)iVar9 * 4 != lVar10; lVar10 = lVar10 + 4) {
      col = *(int *)((long)piVar3 + lVar10);
      pdVar2 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + col;
      local_5d = *pdVar2 <= 0.0 && *pdVar2 != 0.0;
      std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
      emplace_back<int&,bool>
                ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
                 &clqvars,&col,&local_5d);
    }
    partitionStart = &this->cliquePartitionStart;
    HighsCliqueTable::cliquePartition(cliqueTable,&this->model->col_cost_,&clqvars,partitionStart);
    piVar3 = (this->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (int)((ulong)((long)(this->cliquePartitionStart).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar3) >> 2) - 1;
    if (uVar8 == this->numBinary) {
      std::vector<int,_std::allocator<int>_>::resize(partitionStart,1);
    }
    else {
      uVar7 = 0;
      uVar12 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar12 = uVar7;
      }
      iVar9 = 0;
      uVar1 = 0;
      while (uVar11 = uVar1, uVar12 != uVar11) {
        uVar1 = uVar11 + 1;
        if (piVar3[uVar11 + 1] - piVar3[uVar11] != 1) {
          piVar3[uVar7] = iVar9;
          piVar4 = (this->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar10 = (long)piVar3[uVar11]; lVar10 < piVar3[uVar1]; lVar10 = lVar10 + 1) {
            piVar4[(uint)clqvars.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar10] & 0x7fffffff] = iVar9;
            iVar9 = iVar9 + 1;
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        }
      }
      piVar3[uVar7] = iVar9;
      std::vector<int,_std::allocator<int>_>::resize(partitionStart,(ulong)((int)uVar7 + 1));
      lVar10 = (long)this->numBinary;
      uVar12 = 0;
      uVar8 = 0;
      if (lVar10 != 0) {
        begin._M_current =
             (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        iVar9 = pdqsort_detail::log2<long>(lVar10);
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0,false>
                  (begin,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (begin._M_current + lVar10),(anon_class_8_1_8991fb9c)this,iVar9,true);
        uVar8 = this->numBinary;
      }
      pHVar5 = this->model;
      piVar3 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar7 = uVar12;
      }
      for (; uVar7 != uVar12; uVar12 = uVar12 + 1) {
        pdVar6[uVar12] =
             (pHVar5->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[piVar3[uVar12]];
      }
    }
    std::_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
    ~_Vector_base(&clqvars.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 );
  }
  return;
}

Assistant:

void HighsObjectiveFunction::setupCliquePartition(
    const HighsDomain& globaldom, HighsCliqueTable& cliqueTable) {
  // skip if not more than 1 binary column is present
  if (numBinary <= 1) return;

  std::vector<HighsCliqueTable::CliqueVar> clqvars;

  auto binaryEnd = objectiveNonzeros.begin() + numBinary;

  for (auto it = objectiveNonzeros.begin(); it != binaryEnd; ++it) {
    HighsInt col = *it;
    clqvars.emplace_back(col, model->col_cost_[col] < 0.0);
  }

  cliqueTable.cliquePartition(model->col_cost_, clqvars, cliquePartitionStart);
  HighsInt numPartitions = cliquePartitionStart.size() - 1;
  if (numPartitions == numBinary)
    cliquePartitionStart.resize(1);
  else {
    HighsInt p = 0;
    HighsInt k = 0;

    for (HighsInt i = 0; i < numPartitions; ++i) {
      if (cliquePartitionStart[i + 1] - cliquePartitionStart[i] == 1) continue;

      cliquePartitionStart[p] = k;

      for (HighsInt j = cliquePartitionStart[i];
           j < cliquePartitionStart[i + 1]; ++j) {
        colToPartition[clqvars[j].col] = k++;
      }

      ++p;
    }

    cliquePartitionStart[p] = k;
    cliquePartitionStart.resize(p + 1);

    pdqsort(objectiveNonzeros.begin(), objectiveNonzeros.begin() + numBinary,
            [&](HighsInt i, HighsInt j) {
              return std::make_pair((HighsUInt)colToPartition[i],
                                    HighsHashHelpers::hash(i)) <
                     std::make_pair((HighsUInt)colToPartition[j],
                                    HighsHashHelpers::hash(j));
            });

    for (HighsInt i = 0; i < numBinary; ++i)
      objectiveVals[i] = model->col_cost_[objectiveNonzeros[i]];
  }
}